

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_modsqrt(ModsqrtContext *sc,mp_int *x,uint *success)

{
  mp_int *pmVar1;
  mp_int *x_00;
  
  pmVar1 = monty_import(sc->mc,x);
  x_00 = monty_modsqrt(sc,pmVar1,success);
  mp_free(pmVar1);
  pmVar1 = monty_export(sc->mc,x_00);
  mp_free(x_00);
  return pmVar1;
}

Assistant:

mp_int *mp_modsqrt(ModsqrtContext *sc, mp_int *x, unsigned *success)
{
    mp_int *mx = monty_import(sc->mc, x);
    mp_int *mroot = monty_modsqrt(sc, mx, success);
    mp_free(mx);
    mp_int *root = monty_export(sc->mc, mroot);
    mp_free(mroot);
    return root;
}